

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::ZipDatabase::get_hash_list_for_resource_tag
          (ZipDatabase *this,ResourceTag tag,size_t *hash_count,Hash *hashes)

{
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry> *blob;
  iterator __end3;
  iterator __begin3;
  unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
  *__range3;
  Hash *iter;
  size_t size;
  Hash *hashes_local;
  size_t *hash_count_local;
  ResourceTag tag_local;
  ZipDatabase *this_local;
  
  sVar2 = std::
          unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
          ::size(this->seen_blobs + tag);
  if (hashes == (Hash *)0x0) {
    *hash_count = sVar2;
  }
  else if (sVar2 != *hash_count) {
    return false;
  }
  if (hashes != (Hash *)0x0) {
    __end3 = std::
             unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
             ::begin(this->seen_blobs + tag);
    blob = (pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry> *)
           std::
           unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
           ::end(this->seen_blobs + tag);
    __range3 = (unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
                *)hashes;
    while (bVar1 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
                                *)&blob), bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false,_false>
               ::operator*(&__end3);
      (__range3->_M_h)._M_buckets = (__buckets_ptr)ppVar3->first;
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false,_false>::
      operator++(&__end3);
      __range3 = (unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
                  *)&(__range3->_M_h)._M_bucket_count;
    }
    std::sort<unsigned_long*>(hashes,hashes + sVar2);
  }
  return true;
}

Assistant:

bool get_hash_list_for_resource_tag(ResourceTag tag, size_t *hash_count, Hash *hashes) override
	{
		size_t size = seen_blobs[tag].size();
		if (hashes)
		{
			if (size != *hash_count)
				return false;
		}
		else
			*hash_count = size;

		if (hashes)
		{
			Hash *iter = hashes;
			for (auto &blob : seen_blobs[tag])
				*iter++ = blob.first;

			// Make replay more deterministic.
			sort(hashes, hashes + size);
		}
		return true;
	}